

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globalcontext.cc
# Opt level: O1

void __thiscall
ContextInternal::restoreXml(ContextInternal *this,Element *el,AddrSpaceManager *manage)

{
  Element *el_00;
  int iVar1;
  vector<TrackedContext,_std::allocator<TrackedContext>_> *vec;
  LowlevelError *this_00;
  pointer ppEVar2;
  Address addr;
  Address local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppEVar2 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      el_00 = *ppEVar2;
      iVar1 = std::__cxx11::string::compare((char *)el_00);
      if (iVar1 == 0) {
        if ((int)((ulong)((long)(el_00->attr).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(el_00->attr).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5) == 0) {
          local_50._M_dataplus._M_p = (pointer)0x0;
        }
        else {
          Address::restoreXml((Address *)&local_50,el_00,manage);
        }
        local_60.base = (AddrSpace *)0x0;
        restoreContext(this,el_00,(Address *)&local_50,&local_60);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)el_00);
        if (iVar1 != 0) {
          this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
          std::operator+(&local_50,"Bad <context_points> tag: ",&el_00->name);
          LowlevelError::LowlevelError(this_00,&local_50);
          __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
        Address::restoreXml((Address *)&local_50,el_00,manage);
        vec = partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>::split
                        (&this->trackbase,(Address *)&local_50);
        ContextDatabase::restoreTracked(el_00,manage,vec);
      }
      ppEVar2 = ppEVar2 + 1;
    } while (ppEVar2 !=
             (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void ContextInternal::restoreXml(const Element *el,const AddrSpaceManager *manage)

{
  const List &list(el->getChildren());
  List::const_iterator iter = list.begin();

  while(iter != list.end()) {
    const Element *subel = *iter;
    if (subel->getName() == "context_pointset") {
      if (subel->getNumAttributes()==0) {
	restoreContext(subel,Address(),Address());	// Restore the default value
      }
      else {
	Address addr = Address::restoreXml(subel,manage);
	restoreContext(subel,addr,Address());
      }
    }
    else if (subel->getName() == "tracked_pointset") {
      Address addr = Address::restoreXml(subel,manage);
      restoreTracked(subel,manage,trackbase.split(addr) );
    }
    else
      throw LowlevelError("Bad <context_points> tag: "+subel->getName());
    ++iter;
  }
}